

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O0

void __thiscall amrex::MLCellLinOp::computeVolInv(MLCellLinOp *this)

{
  initializer_list<std::reference_wrapper<double>_> iVar1;
  bool bVar2;
  FabFactory<amrex::FArrayBox> *pFVar3;
  double *pdVar4;
  anon_class_8_1_8991fb9c *in_RDI;
  EBFArrayBoxFactory *factory;
  Real temp2;
  Real temp1;
  int mgbottom;
  anon_class_8_1_8991fb9c f;
  int amrlev;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  MLLinOp *in_stack_ffffffffffffff20;
  Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  *this_00;
  iterator in_stack_ffffffffffffff28;
  double dVar5;
  vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffff30;
  size_type in_stack_ffffffffffffff38;
  vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffff40;
  long local_a8;
  Vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff68;
  undefined1 local_70 [16];
  undefined1 *local_60;
  undefined8 local_58;
  long local_38;
  double local_30;
  Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  *local_28;
  int local_1c;
  int local_c;
  
  bVar2 = std::
          vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
          ::empty(in_stack_ffffffffffffff30);
  if (bVar2) {
    std::
    vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
    ::resize(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    for (local_c = 0; local_c < *(int *)((long)&in_RDI[6].this + 4); local_c = local_c + 1) {
      in_stack_ffffffffffffff68 =
           Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
           ::operator[]((Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                         *)in_stack_ffffffffffffff20,
                        CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      MLLinOp::NMGLevels(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff40,
                 in_stack_ffffffffffffff38);
    }
    computeVolInv::anon_class_8_1_8991fb9c::operator()
              (in_RDI,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68
              );
    local_1c = MLLinOp::NMGLevels(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    local_1c = local_1c + -1;
    computeVolInv::anon_class_8_1_8991fb9c::operator()
              (in_RDI,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68
              );
    pFVar3 = MLLinOp::Factory(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                              in_stack_ffffffffffffff18);
    if (pFVar3 == (FabFactory<amrex::FArrayBox> *)0x0) {
      local_a8 = 0;
    }
    else {
      local_a8 = __dynamic_cast(pFVar3,&FabFactory<amrex::FArrayBox>::typeinfo,
                                &EBFArrayBoxFactory::typeinfo,0);
    }
    local_38 = local_a8;
    if (local_a8 == 0) {
      Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
      ::operator[]((Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                    *)in_stack_ffffffffffffff20,
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      pdVar4 = Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20,
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      local_28 = (Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                  *)*pdVar4;
      Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
      ::operator[]((Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                    *)in_stack_ffffffffffffff20,
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      pdVar4 = Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20,
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      local_30 = *pdVar4;
    }
    else {
      in_RDI = in_RDI + 0x5a;
      Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
      ::operator[]((Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                    *)in_stack_ffffffffffffff20,
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      Vector<double,_std::allocator<double>_>::operator[]
                ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20,
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      std::reference_wrapper<double>::reference_wrapper<double&,void,double*>
                ((reference_wrapper<double> *)in_stack_ffffffffffffff20,
                 (double *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
      ::operator[]((Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                    *)in_stack_ffffffffffffff20,
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      Vector<double,_std::allocator<double>_>::operator[]
                ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20,
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      std::reference_wrapper<double>::reference_wrapper<double&,void,double*>
                ((reference_wrapper<double> *)in_stack_ffffffffffffff20,
                 (double *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      local_58 = 2;
      local_60 = local_70;
      std::allocator<std::reference_wrapper<double>_>::allocator
                ((allocator<std::reference_wrapper<double>_> *)0x129352e);
      iVar1._M_len = (size_type)in_RDI;
      iVar1._M_array = in_stack_ffffffffffffff28;
      Vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>::
      vector((Vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
              *)in_stack_ffffffffffffff20,iVar1,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      ParallelContext::CommunicatorSub();
      ParallelAllReduce::Sum<double>
                ((Vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
                  *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      Vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>::
      ~Vector((Vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
               *)0x1293575);
      std::allocator<std::reference_wrapper<double>_>::~allocator
                ((allocator<std::reference_wrapper<double>_> *)0x129357f);
      Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
      ::operator[]((Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                    *)in_stack_ffffffffffffff20,
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      pdVar4 = Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20,
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      local_28 = (Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                  *)(1.0 / *pdVar4);
      Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
      ::operator[]((Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                    *)in_stack_ffffffffffffff20,
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      pdVar4 = Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20,
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      local_30 = 1.0 / *pdVar4;
    }
    this_00 = local_28;
    Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
    ::operator[](local_28,CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    pdVar4 = Vector<double,_std::allocator<double>_>::operator[]
                       ((Vector<double,_std::allocator<double>_> *)this_00,
                        CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    *pdVar4 = (double)this_00;
    dVar5 = local_30;
    Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
    ::operator[](this_00,CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    pdVar4 = Vector<double,_std::allocator<double>_>::operator[]
                       ((Vector<double,_std::allocator<double>_> *)this_00,
                        CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    *pdVar4 = dVar5;
  }
  return;
}

Assistant:

void
MLCellLinOp::computeVolInv () const
{
    if (!m_volinv.empty()) return;

    m_volinv.resize(m_num_amr_levels);
    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev) {
        m_volinv[amrlev].resize(NMGLevels(amrlev));
    }

    // We don't need to compute for every level

    auto f = [&] (int amrlev, int mglev) {
#ifdef AMREX_USE_EB
        auto factory = dynamic_cast<EBFArrayBoxFactory const*>(Factory(amrlev,mglev));
        if (factory)
        {
            const MultiFab& vfrac = factory->getVolFrac();
            m_volinv[amrlev][mglev] = vfrac.sum(0,true);
        }
        else
#endif
        {
            m_volinv[amrlev][mglev]
                = Real(1.0 / compactify(Geom(amrlev,mglev).Domain()).d_numPts());
        }
    };

    // amrlev = 0, mglev = 0
    f(0,0);

    int mgbottom = NMGLevels(0)-1;
    f(0,mgbottom);

#ifdef AMREX_USE_EB
    Real temp1, temp2;
    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(Factory(0,0));
    if (factory)
    {
        ParallelAllReduce::Sum<Real>({m_volinv[0][0], m_volinv[0][mgbottom]},
                                     ParallelContext::CommunicatorSub());
        temp1 = Real(1.0)/m_volinv[0][0];
        temp2 = Real(1.0)/m_volinv[0][mgbottom];
    }
    else
    {
        temp1 = m_volinv[0][0];
        temp2 = m_volinv[0][mgbottom];
    }
    m_volinv[0][0] = temp1;
    m_volinv[0][mgbottom] = temp2;
#endif
}